

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O1

void __thiscall icu_63::Calendar::complete(Calendar *this,UErrorCode *status)

{
  UErrorCode UVar1;
  
  if (this->fIsTimeSet == '\0') {
    (*(this->super_UObject)._vptr_UObject[0x1c])(this,status);
    UVar1 = *status;
    if (UVar1 < U_ILLEGAL_ARGUMENT_ERROR) {
      if ((this->fLenient != '\0') || (this->fAreAllFieldsSet == '\0')) {
        this->fAreFieldsSet = '\0';
      }
      this->fIsTimeSet = '\x01';
      this->fAreFieldsVirtuallySet = '\0';
    }
    if (U_ZERO_ERROR < UVar1) {
      return;
    }
  }
  if ((this->fAreFieldsSet == '\0') &&
     ((*(this->super_UObject)._vptr_UObject[0x1d])(this,status), *status < U_ILLEGAL_ARGUMENT_ERROR)
     ) {
    this->fAreFieldsSet = '\x01';
    this->fAreAllFieldsSet = '\x01';
  }
  return;
}

Assistant:

void
Calendar::complete(UErrorCode& status)
{
    if (!fIsTimeSet) {
        updateTime(status);
        /* Test for buffer overflows */
        if(U_FAILURE(status)) {
            return;
        }
    }
    if (!fAreFieldsSet) {
        computeFields(status); // fills in unset fields
        /* Test for buffer overflows */
        if(U_FAILURE(status)) {
            return;
        }
        fAreFieldsSet         = TRUE;
        fAreAllFieldsSet     = TRUE;
    }
}